

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<double,_int,_THashTraits<double>,_TValueTraits<int>_>::SetNodeVector
          (TMap<double,_int,_THashTraits<double>,_TValueTraits<int>_> *this,hash_t size)

{
  uint uVar1;
  Node *pNVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = 1;
  do {
    uVar3 = uVar1;
    uVar1 = uVar3 * 2;
  } while (uVar3 < size);
  this->Size = uVar3;
  pNVar2 = (Node *)M_Malloc_Dbg((ulong)uVar3 * 0x18,
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                                ,0x33f);
  this->Nodes = pNVar2;
  uVar4 = (ulong)this->Size;
  this->LastFree = pNVar2 + uVar4;
  if (uVar4 != 0) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&pNVar2->Next + lVar5) = 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 * 0x18 != lVar5);
  }
  return;
}

Assistant:

void SetNodeVector(hash_t size)
	{
		// Round size up to nearest power of 2
		for (Size = 1; Size < size; Size <<= 1)
		{ }
		Nodes = (Node *)M_Malloc(Size * sizeof(Node));
		LastFree = &Nodes[Size];	/* all positions are free */
		for (hash_t i = 0; i < Size; ++i)
		{
			Nodes[i].SetNil();
		}
	}